

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * phosg::escape_url(string *__return_storage_ptr__,string *s,bool escape_slash)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  string local_70;
  char local_39;
  const_iterator cStack_38;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  bool escape_slash_local;
  string *s_local;
  string *ret;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (s);
  cStack_38 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        (s);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1,&stack0xffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_39 = *pcVar3;
    iVar2 = isalnum((int)local_39);
    if ((((((iVar2 == 0) && (local_39 != '-')) && (local_39 != '_')) &&
         ((local_39 != '.' && (local_39 != '~')))) && ((local_39 != '=' && (local_39 != '&')))) &&
       ((escape_slash || (local_39 != '/')))) {
      string_printf_abi_cxx11_(&local_70,"%%%02hhX",(ulong)(uint)(int)local_39);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,local_39);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

string escape_url(const string& s, bool escape_slash) {
  string ret;
  for (char ch : s) {
    if (isalnum(ch) || (ch == '-') || (ch == '_') || (ch == '.') ||
        (ch == '~') || (ch == '=') || (ch == '&') || (!escape_slash && (ch == '/'))) {
      ret += ch;
    } else {
      ret += string_printf("%%%02hhX", ch);
    }
  }
  return ret;
}